

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,BaseType *type)

{
  char *pcVar1;
  char *pcVar2;
  
  switch(*type) {
  case BASE_TYPE_NONE:
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_UCHAR:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "UByte";
    pcVar1 = "";
    break;
  case BASE_TYPE_BOOL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Boolean";
    pcVar1 = "";
    break;
  case BASE_TYPE_CHAR:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Byte";
    pcVar1 = "";
    break;
  case BASE_TYPE_SHORT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Short";
    pcVar1 = "";
    break;
  case BASE_TYPE_USHORT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "UShort";
    pcVar1 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Int";
    pcVar1 = "";
    break;
  case BASE_TYPE_UINT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "UInt";
    pcVar1 = "";
    break;
  case BASE_TYPE_LONG:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Long";
    pcVar1 = "";
    break;
  case BASE_TYPE_ULONG:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "ULong";
    pcVar1 = "";
    break;
  case BASE_TYPE_FLOAT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Float";
    pcVar1 = "";
    break;
  case BASE_TYPE_DOUBLE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Double";
    pcVar1 = "";
    break;
  case BASE_TYPE_STRING:
  case BASE_TYPE_STRUCT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Offset";
    pcVar1 = "";
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_ARRAY:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "VectorOffset";
    pcVar1 = "";
    break;
  case BASE_TYPE_UNION:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "UnionOffset";
    pcVar1 = "";
    break;
  case BASE_TYPE_VECTOR64:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp"
                  ,0xe2,
                  "std::string flatbuffers::kotlin::KotlinKMPGenerator::GenTypeBasic(const BaseType &) const"
                 );
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const BaseType &type) const {
    switch (type) {
      case BASE_TYPE_NONE:
      case BASE_TYPE_UTYPE: return "UByte";
      case BASE_TYPE_BOOL: return "Boolean";
      case BASE_TYPE_CHAR: return "Byte";
      case BASE_TYPE_UCHAR: return "UByte";
      case BASE_TYPE_SHORT: return "Short";
      case BASE_TYPE_USHORT: return "UShort";
      case BASE_TYPE_INT: return "Int";
      case BASE_TYPE_UINT: return "UInt";
      case BASE_TYPE_LONG: return "Long";
      case BASE_TYPE_ULONG: return "ULong";
      case BASE_TYPE_FLOAT: return "Float";
      case BASE_TYPE_DOUBLE: return "Double";
      case BASE_TYPE_STRING:
      case BASE_TYPE_STRUCT: return "Offset";
      case BASE_TYPE_UNION: return "UnionOffset";
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_ARRAY: return "VectorOffset";
      // VECTOR64 not supported
      case BASE_TYPE_VECTOR64: FLATBUFFERS_ASSERT(0);
    }
    return "Int";
  }